

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall iqxmlrpc::http::Header::set_option_default(Header *this,string *name,string *value)

{
  bool bVar1;
  string *value_local;
  string *name_local;
  Header *this_local;
  
  bVar1 = option_exists(this,name);
  if (!bVar1) {
    set_option(this,name,value);
  }
  return;
}

Assistant:

void Header::set_option_default(const std::string& name, const std::string& value)
{
  if (option_exists(name))
    return;

  set_option(name, value);
}